

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

void idr_register(idr *idr,isoent *isoent,int weight,int noff)

{
  idrent *self;
  int iVar1;
  idrent *piVar2;
  int iVar3;
  idrent *piVar4;
  
  piVar2 = idr->idrent_pool;
  iVar1 = idr->pool_idx;
  idr->pool_idx = iVar1 + 1;
  self = piVar2 + iVar1;
  piVar2[iVar1].wnext = (idrent *)0x0;
  (&piVar2[iVar1].wnext)[1] = (idrent *)0x0;
  piVar2[iVar1].isoent = isoent;
  piVar2[iVar1].weight = weight;
  piVar2[iVar1].noff = noff;
  piVar2[iVar1].rename_num = 0;
  iVar3 = __archive_rb_tree_insert_node(&idr->rbtree,&self->rbnode);
  if (iVar3 == 0) {
    piVar4 = (idrent *)__archive_rb_tree_find_node(&idr->rbtree,self->isoent);
    if (piVar4 != (idrent *)0x0) {
      self->avail = piVar4;
      *(idr->wait_list).last = self;
      (idr->wait_list).last = &piVar2[iVar1].wnext;
    }
  }
  return;
}

Assistant:

static void
idr_register(struct idr *idr, struct isoent *isoent, int weight, int noff)
{
	struct idrent *idrent, *n;

	idrent = &(idr->idrent_pool[idr->pool_idx++]);
	idrent->wnext = idrent->avail = NULL;
	idrent->isoent = isoent;
	idrent->weight = weight;
	idrent->noff = noff;
	idrent->rename_num = 0;

	if (!__archive_rb_tree_insert_node(&(idr->rbtree), &(idrent->rbnode))) {
		n = (struct idrent *)__archive_rb_tree_find_node(
		    &(idr->rbtree), idrent->isoent);
		if (n != NULL) {
			/* this `idrent' needs to rename. */
			idrent->avail = n;
			*idr->wait_list.last = idrent;
			idr->wait_list.last = &(idrent->wnext);
		}
	}
}